

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O0

void google::anon_unknown_0::DumpStackFrameInfo(char *prefix,void *pc)

{
  undefined *puVar1;
  bool bVar2;
  size_t sVar3;
  undefined1 local_840 [4];
  int width;
  MinimalFormatter formatter;
  char buf [1024];
  char symbolized [1024];
  char *local_20;
  char *symbol;
  void *pc_local;
  char *prefix_local;
  
  local_20 = "(unknown)";
  bVar2 = Symbolize((void *)((long)pc + -1),buf + 0x3f8,0x400);
  if (bVar2) {
    local_20 = buf + 0x3f8;
  }
  MinimalFormatter::MinimalFormatter((MinimalFormatter *)local_840,(char *)&formatter.end_,0x400);
  MinimalFormatter::AppendString((MinimalFormatter *)local_840,prefix);
  MinimalFormatter::AppendString((MinimalFormatter *)local_840,"@ ");
  MinimalFormatter::AppendHexWithPadding((MinimalFormatter *)local_840,(uint64)pc,0x12);
  MinimalFormatter::AppendString((MinimalFormatter *)local_840," ");
  MinimalFormatter::AppendString((MinimalFormatter *)local_840,local_20);
  MinimalFormatter::AppendString((MinimalFormatter *)local_840,"\n");
  puVar1 = (anonymous_namespace)::g_failure_writer;
  sVar3 = MinimalFormatter::num_bytes_written((MinimalFormatter *)local_840);
  (*(code *)puVar1)(&formatter.end_,sVar3);
  return;
}

Assistant:

void DumpStackFrameInfo(const char* prefix, void* pc) {
  // Get the symbol name.
  const char* symbol = "(unknown)";
  char symbolized[1024];  // Big enough for a sane symbol.
  // Symbolizes the previous address of pc because pc may be in the
  // next function.
  if (Symbolize(reinterpret_cast<char*>(pc) - 1, symbolized,
                sizeof(symbolized))) {
    symbol = symbolized;
  }

  char buf[1024];  // Big enough for stack frame info.
  MinimalFormatter formatter(buf, sizeof(buf));

  formatter.AppendString(prefix);
  formatter.AppendString("@ ");
  const int width = 2 * sizeof(void*) + 2;  // + 2  for "0x".
  formatter.AppendHexWithPadding(reinterpret_cast<uintptr_t>(pc), width);
  formatter.AppendString(" ");
  formatter.AppendString(symbol);
  formatter.AppendString("\n");
  g_failure_writer(buf, formatter.num_bytes_written());
}